

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  long lVar1;
  ulong uVar2;
  char *__s1;
  char cVar3;
  int iVar4;
  long *plVar5;
  FieldDescriptor *pFVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  long *plVar10;
  long *plVar11;
  
  lVar1 = *(long *)(*(long *)(this + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(this + 0x90) + 0x10);
  __s1 = (key->_M_dataplus)._M_p;
  cVar3 = *__s1;
  if (cVar3 == '\0') {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    pcVar9 = __s1;
    do {
      pcVar9 = pcVar9 + 1;
      lVar7 = (long)cVar3 + lVar7 * 5;
      cVar3 = *pcVar9;
    } while (cVar3 != '\0');
  }
  plVar11 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar7) % uVar2) * 8);
  do {
    if (plVar11 == (long *)0x0) {
      plVar8 = *(long **)(lVar1 + uVar2 * 8);
      plVar11 = plVar8;
LAB_001cbf03:
      plVar10 = plVar11 + 2;
      plVar5 = plVar10;
      if (plVar11 == plVar8) {
        plVar5 = (long *)&(anonymous_namespace)::kNullSymbol;
      }
      if (((int)*plVar5 == 2) || ((anonymous_namespace)::kNullSymbol != 0)) {
        if (plVar11 == plVar8) {
          plVar10 = (long *)&(anonymous_namespace)::kNullSymbol;
        }
        if ((int)*plVar5 != 2) {
          plVar10 = (long *)&(anonymous_namespace)::kNullSymbol;
        }
        pFVar6 = (FieldDescriptor *)0x0;
        if (((FieldDescriptor *)plVar10[1])[0x34] != (FieldDescriptor)0x0) {
          pFVar6 = (FieldDescriptor *)plVar10[1];
        }
      }
      else {
        pFVar6 = (FieldDescriptor *)0x0;
      }
      return pFVar6;
    }
    if (((FileDescriptor *)*plVar11 == this) &&
       (iVar4 = strcmp(__s1,(char *)plVar11[1]), iVar4 == 0)) {
      plVar8 = *(long **)(lVar1 + uVar2 * 8);
      goto LAB_001cbf03;
    }
    plVar11 = (long *)plVar11[4];
  } while( true );
}

Assistant:

const FieldDescriptor*
FileDescriptor::FindExtensionByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}